

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

bool __thiscall
slang::parsing::Preprocessor::expectTimeScaleSpecifier
          (Preprocessor *this,Token *token,TimeScaleValue *value)

{
  Token *pTVar1;
  double value_00;
  Info *pIVar2;
  long lVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  char *pcVar6;
  bool bVar7;
  NumericTokenFlags NVar8;
  optional<slang::TimeUnit> timeUnit;
  optional<slang::TimeScaleValue> oVar9;
  SourceLocation location;
  Token TVar10;
  string_view sVar11;
  string_view sVar12;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar13;
  SourceRange SVar14;
  Token suffix;
  size_t lengthConsumed;
  void *local_a8;
  uint local_a0;
  byte local_9b;
  char *local_98;
  Info *pIStack_90;
  Token local_80;
  __extent_storage<18446744073709551615UL> local_70;
  pointer local_68;
  BumpAllocator *local_60;
  size_t local_58;
  Token local_50;
  char *local_40;
  char *pcStack_38;
  
  if ((this->currentToken).info == (Info *)0x0) {
    TVar10 = nextProcessed(this);
    this->currentToken = TVar10;
  }
  if ((this->currentToken).kind == IntegerLiteral) {
    pTVar1 = &this->currentToken;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar10 = nextProcessed(this);
      this->currentToken = TVar10;
    }
    local_98._0_2_ = (this->currentToken).kind;
    local_98._2_1_ = (this->currentToken).field_0x2;
    local_98._3_1_ = (this->currentToken).numFlags;
    local_98._4_4_ = (this->currentToken).rawLen;
    pIStack_90 = (this->currentToken).info;
    uVar4 = pTVar1->field_0x2;
    NVar8.raw = (pTVar1->numFlags).raw;
    uVar5 = pTVar1->rawLen;
    pIVar2 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar4;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar8.raw;
    (this->lastConsumed).rawLen = uVar5;
    (this->lastConsumed).info = pIVar2;
    Token::Token(&local_50);
    pTVar1->kind = local_50.kind;
    pTVar1->field_0x2 = local_50._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
    pTVar1->rawLen = local_50.rawLen;
    (this->currentToken).info = local_50.info;
    *(char **)token = local_98;
    token->info = pIStack_90;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar10 = nextProcessed(this);
      this->currentToken = TVar10;
    }
    local_80.kind = (this->currentToken).kind;
    local_80._2_1_ = (this->currentToken).field_0x2;
    local_80.numFlags.raw = (this->currentToken).numFlags.raw;
    local_80.rawLen = (this->currentToken).rawLen;
    local_80.info = (this->currentToken).info;
    if ((local_80.kind == Identifier) && (bVar7 = Token::isOnSameLine(&local_80), bVar7)) {
      sVar11 = Token::rawText(&local_80);
      sVar12._M_str = (char *)&local_58;
      sVar12._M_len = (size_t)sVar11._M_str;
      timeUnit = suffixToTimeUnit((slang *)sVar11._M_len,sVar12,&local_58);
      if ((((ushort)timeUnit.super__Optional_base<slang::TimeUnit,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::TimeUnit> >> 8 & 1) != 0) &&
         (sVar11 = Token::rawText(&local_80), local_58 == sVar11._M_len)) {
        if ((this->currentToken).info == (Info *)0x0) {
          TVar10 = nextProcessed(this);
          this->currentToken = TVar10;
        }
        uVar4 = pTVar1->field_0x2;
        NVar8.raw = (pTVar1->numFlags).raw;
        uVar5 = pTVar1->rawLen;
        pIVar2 = (this->currentToken).info;
        (this->lastConsumed).kind = pTVar1->kind;
        (this->lastConsumed).field_0x2 = uVar4;
        (this->lastConsumed).numFlags = (NumericTokenFlags)NVar8.raw;
        (this->lastConsumed).rawLen = uVar5;
        (this->lastConsumed).info = pIVar2;
        Token::Token(&local_50);
        pTVar1->kind = local_50.kind;
        pTVar1->field_0x2 = local_50._2_1_;
        pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
        pTVar1->rawLen = local_50.rawLen;
        (this->currentToken).info = local_50.info;
        sVar11 = Token::rawText(token);
        local_98 = sVar11._M_str;
        sVar11 = Token::rawText(&local_80);
        sVar12 = Token::rawText(&local_80);
        pcVar6 = local_98;
        lVar3 = sVar12._M_len - (long)local_98;
        local_60 = this->alloc;
        sVar13 = Token::trivia(token);
        local_70 = sVar13._M_extent._M_extent_value;
        local_68 = sVar13._M_ptr;
        pcStack_38 = pcVar6;
        local_40 = sVar11._M_str + lVar3;
        location = Token::location(token);
        Token::intValue((Token *)&local_a8);
        value_00 = SVInt::toDouble((SVInt *)&local_a8);
        sVar11._M_str = pcStack_38;
        sVar11._M_len = (size_t)local_40;
        sVar13._M_extent._M_extent_value = local_70._M_extent_value;
        sVar13._M_ptr = local_68;
        Token::Token(&local_50,local_60,TimeLiteral,sVar13,sVar11,location,value_00,false,timeUnit);
        token->kind = local_50.kind;
        token->field_0x2 = local_50._2_1_;
        token->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
        token->rawLen = local_50.rawLen;
        token->info = local_50.info;
        if (((0x40 < local_a0) || ((local_9b & 1) != 0)) && (local_a8 != (void *)0x0)) {
          operator_delete__(local_a8);
        }
        goto LAB_006a4245;
      }
    }
    SVar14 = Token::range(token);
    Diagnostics::add(this->diagnostics,(DiagCode)0xa0004,SVar14);
  }
  else {
    TVar10 = expect(this,TimeLiteral);
    *token = TVar10;
    if ((token->field_0x2 & 1) == 0) {
LAB_006a4245:
      local_98 = (char *)Token::realValue(token);
      NVar8 = Token::numericFlags(token);
      oVar9 = TimeScaleValue::fromLiteral
                        ((double)local_98,NVar8.raw >> 3 & (Picoseconds|Nanoseconds));
      bVar7 = (bool)(oVar9.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_engaged & 1);
      if (((uint3)oVar9.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::TimeScaleValue> & 0x10000) != 0) {
        *value = (TimeScaleValue)
                 oVar9.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
        return bVar7;
      }
      SVar14 = Token::range(token);
      Diagnostics::add(this->diagnostics,(DiagCode)0xf0004,SVar14);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool Preprocessor::expectTimeScaleSpecifier(Token& token, TimeScaleValue& value) {
    if (peek(TokenKind::IntegerLiteral)) {
        // We wanted to see a time literal here, but for directives we will allow there
        // to be a space between the integer and suffix portions of the time.
        token = consume();

        auto suffix = peek();
        if (suffix.kind != TokenKind::Identifier || !suffix.isOnSameLine()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        size_t lengthConsumed;
        auto unit = suffixToTimeUnit(suffix.rawText(), lengthConsumed);
        if (!unit || lengthConsumed != suffix.rawText().length()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        // Glue the tokens together to form a "time literal"
        consume();
        auto start = token.rawText().data();
        auto end = suffix.rawText().data() + suffix.rawText().size();
        auto text = std::string_view(start, size_t(end - start));

        token = Token(alloc, TokenKind::TimeLiteral, token.trivia(), text, token.location(),
                      token.intValue().toDouble(), false, unit);
    }
    else {
        token = expect(TokenKind::TimeLiteral);
        if (token.isMissing())
            return false;
    }

    auto checked = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
    if (!checked) {
        addDiag(diag::InvalidTimeScaleSpecifier, token.range());
        return false;
    }

    value = *checked;
    return true;
}